

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall
entityx::EventManager::unsubscribe<Explosion,ExplosionSystem>
          (EventManager *this,ExplosionSystem *receiver)

{
  bool bVar1;
  weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *this_00;
  key_type *__x;
  long in_RSI;
  weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *ptr;
  unsigned_long connection;
  mapped_type pair;
  BaseReceiver *base;
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  *in_stack_ffffffffffffff78;
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  *in_stack_ffffffffffffff80;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *in_stack_ffffffffffffff90;
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  local_58;
  undefined8 local_40;
  Family local_38;
  undefined1 local_30 [16];
  undefined8 local_20;
  long local_18;
  
  this_00 = (weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *)
            (in_RSI + 8);
  local_18 = in_RSI;
  local_38 = Event<Explosion>::family();
  Catch::clara::std::
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
                *)in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  Catch::clara::std::
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  ::pair(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_40 = local_20;
  local_58.second = (unsigned_long)local_30;
  bVar1 = Catch::clara::std::
          __weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
          ::expired((__weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)0x2a9130);
  if (!bVar1) {
    in_stack_ffffffffffffff80 = &local_58;
    Catch::clara::std::
    weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::lock
              (this_00);
    Catch::clara::std::
    __shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a9152);
    Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::disconnect
              (in_stack_ffffffffffffff90,(size_t)this_00);
    Catch::clara::std::
    shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
    ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                 *)0x2a916b);
  }
  __x = (key_type *)(local_18 + 8);
  Event<Explosion>::family();
  Catch::clara::std::
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  ::erase((unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
           *)in_stack_ffffffffffffff80,__x);
  Catch::clara::std::
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  ::~pair((pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
           *)0x2a91b8);
  return;
}

Assistant:

void unsubscribe(Receiver &receiver) {
    BaseReceiver &base = receiver;
    // Assert that it has been subscribed before
    assert(base.connections_.find(Event<E>::family()) != base.connections_.end());
    auto pair = base.connections_[Event<E>::family()];
    auto connection = pair.second;
    auto &ptr = pair.first;
    if (!ptr.expired()) {
      ptr.lock()->disconnect(connection);
    }
    base.connections_.erase(Event<E>::family());
  }